

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fflush.c
# Opt level: O3

int fflush(FILE *__stream)

{
  int iVar1;
  int iVar2;
  _PDCLIB_mtx_t *mtx;
  _PDCLIB_file_t *stream;
  
  if (__stream == (FILE *)0x0) {
    mtx = &_PDCLIB_filelist_mtx;
    mtx_lock(&_PDCLIB_filelist_mtx);
    iVar1 = 0;
    for (stream = _PDCLIB_filelist; stream != (_PDCLIB_file_t *)0x0; stream = stream->next) {
      mtx_lock(&stream->mtx);
      if ((stream->status & 0x10) != 0) {
        iVar2 = _PDCLIB_flushbuffer(stream);
        if (iVar2 == -1) {
          iVar1 = -1;
        }
      }
      mtx_unlock(&stream->mtx);
    }
  }
  else {
    mtx = (_PDCLIB_mtx_t *)&__stream->_IO_save_base;
    mtx_lock(mtx);
    iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
  }
  mtx_unlock(mtx);
  return iVar1;
}

Assistant:

int fflush( struct _PDCLIB_file_t * stream )
{
    int rc = 0;

    if ( stream == NULL )
    {
        _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
        stream = _PDCLIB_filelist;

        /* TODO: Check what happens when fflush( NULL ) encounters write errors, in other libs */
        while ( stream != NULL )
        {
            _PDCLIB_LOCK( stream->mtx );

            if ( stream->status & _PDCLIB_FWRITE )
            {
                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    rc = EOF;
                }
            }

            _PDCLIB_UNLOCK( stream->mtx );

            stream = stream->next;
        }

        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    }
    else
    {
        _PDCLIB_LOCK( stream->mtx );
        rc = _PDCLIB_flushbuffer( stream );
        _PDCLIB_UNLOCK( stream->mtx );
    }

    return rc;
}